

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coptccal.cpp
# Opt level: O1

void icu_63::initializeSystemDefaultCentury(void)

{
  UDate millis;
  UErrorCode status;
  BuddhistCalendar calendar;
  UErrorCode local_38c;
  double local_388;
  Locale local_380;
  GregorianCalendar local_2a0;
  
  local_38c = U_ZERO_ERROR;
  Locale::Locale(&local_380,"@calendar=buddhist",(char *)0x0,(char *)0x0,(char *)0x0);
  BuddhistCalendar::BuddhistCalendar((BuddhistCalendar *)&local_2a0,&local_380,&local_38c);
  Locale::~Locale(&local_380);
  if (local_38c < U_ILLEGAL_ARGUMENT_ERROR) {
    millis = Calendar::getNow();
    Calendar::setTimeInMillis(&local_2a0.super_Calendar,millis,&local_38c);
    Calendar::add(&local_2a0.super_Calendar,UCAL_YEAR,-0x50,&local_38c);
    local_388 = Calendar::getTimeInMillis(&local_2a0.super_Calendar,&local_38c);
    gSystemDefaultCenturyStartYear = Calendar::get(&local_2a0.super_Calendar,UCAL_YEAR,&local_38c);
    gSystemDefaultCenturyStart = local_388;
  }
  GregorianCalendar::~GregorianCalendar(&local_2a0);
  return;
}

Assistant:

static void U_CALLCONV initializeSystemDefaultCentury() {
    UErrorCode status = U_ZERO_ERROR;
    CopticCalendar calendar(Locale("@calendar=coptic"), status);
    if (U_SUCCESS(status)) {
        calendar.setTime(Calendar::getNow(), status);
        calendar.add(UCAL_YEAR, -80, status);
        gSystemDefaultCenturyStart = calendar.getTime(status);
        gSystemDefaultCenturyStartYear = calendar.get(UCAL_YEAR, status);
    }
    // We have no recourse upon failure unless we want to propagate the failure
    // out.
}